

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

int amqpvalue_decode_bytes(AMQPVALUE_DECODER_HANDLE handle,uchar *buffer,size_t size)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  size_t used_bytes;
  
  if ((buffer == (uchar *)0x0 || handle == (AMQPVALUE_DECODER_HANDLE)0x0) || size == 0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x1bd9;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_decode_bytes",0x1bd8,1,
                "Bad arguments: decoder_instance = %p, buffer = %p, size = %lu",handle,buffer,size);
    }
  }
  else {
    iVar1 = internal_decoder_decode_bytes(handle->internal_decoder,buffer,size,&used_bytes);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x1be3;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"amqpvalue_decode_bytes",0x1be2,1,"Failed decoding bytes");
      }
    }
  }
  return iVar1;
}

Assistant:

int amqpvalue_decode_bytes(AMQPVALUE_DECODER_HANDLE handle, const unsigned char* buffer, size_t size)
{
    int result;

    AMQPVALUE_DECODER_HANDLE_DATA* decoder_instance = (AMQPVALUE_DECODER_HANDLE_DATA*)handle;
    /* Codes_SRS_AMQPVALUE_01_320: [If handle or buffer are NULL, amqpvalue_decode_bytes shall return a non-zero value.] */
    if ((decoder_instance == NULL) ||
        (buffer == NULL) ||
        /* Codes_SRS_AMQPVALUE_01_321: [If size is 0, amqpvalue_decode_bytes shall return a non-zero value.] */
        (size == 0))
    {
        LogError("Bad arguments: decoder_instance = %p, buffer = %p, size = %lu",
            decoder_instance, buffer, (unsigned long)size);
        result = MU_FAILURE;
    }
    else
    {
        size_t used_bytes;

        /* Codes_SRS_AMQPVALUE_01_318: [amqpvalue_decode_bytes shall decode size bytes that are passed in the buffer argument.] */
        if (internal_decoder_decode_bytes(decoder_instance->internal_decoder, buffer, size, &used_bytes) != 0)
        {
            LogError("Failed decoding bytes");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_319: [On success, amqpvalue_decode_bytes shall return 0.] */
            result = 0;
        }
    }

    return result;
}